

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_18_term(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  G->val[-3] = (PVIPNode *)0x0;
  return;
}

Assistant:

YY_ACTION(void) yy_18_term(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define t G->val[-1]
#define b G->val[-2]
#define e G->val[-3]
  yyprintf((stderr, "do yy_18_term"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {e=NULL; }\n"));
  e=NULL; ;
#undef t
#undef b
#undef e
}